

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enet.h
# Opt level: O2

ENetPeer * enet_host_connect(ENetHost *host,ENetAddress *address,size_t channelCount,uint32_t data)

{
  undefined8 uVar1;
  size_t sVar2;
  ENetChannel *pEVar3;
  ENetPeer *pEVar4;
  uint uVar5;
  ENetChannel *pEVar6;
  size_t sVar7;
  uint32_t *puVar8;
  ENetProtocol command;
  
  sVar2 = 0xff;
  if (channelCount < 0xff) {
    sVar2 = channelCount;
  }
  sVar7 = 1;
  if (channelCount != 0) {
    sVar7 = sVar2;
  }
  puVar8 = &host->peers->windowSize;
  while( true ) {
    pEVar4 = (ENetPeer *)(puVar8 + -0x3d);
    if (host->peers + host->peerCount <= pEVar4) {
      return (ENetPeer *)0x0;
    }
    if (puVar8[-0x2d] == ENET_PEER_STATE_DISCONNECTED) break;
    puVar8 = puVar8 + 0x7a;
  }
  pEVar3 = (ENetChannel *)(*(code *)callbacks_0)(sVar7 * 0x50);
  if (pEVar3 == (ENetChannel *)0x0) {
    pEVar4 = (ENetPeer *)(*(code *)callbacks_2)();
    return pEVar4;
  }
  *(ENetChannel **)(puVar8 + -0x2b) = pEVar3;
  *(size_t *)(puVar8 + -0x29) = sVar7;
  puVar8[-0x2d] = ENET_PEER_STATE_CONNECTING;
  uVar1 = *(undefined8 *)((long)&address->field_0 + 8);
  *(undefined8 *)&((ENetAddress *)(puVar8 + -0x34))->field_0 = *(undefined8 *)&address->field_0;
  *(undefined8 *)(puVar8 + -0x32) = uVar1;
  puVar8[-0x30] = *(uint *)&address->port;
  uVar5 = host->randomSeed + 1;
  host->randomSeed = uVar5;
  puVar8[-0x36] = uVar5;
  pEVar6 = pEVar3;
  if (host->outgoingBandwidth != 0) {
    uVar5 = host->outgoingBandwidth >> 4 & 0xffff000;
    *puVar8 = uVar5;
    if (uVar5 == 0) {
      *puVar8 = 0x1000;
      goto LAB_00106bc8;
    }
    if (uVar5 < 0x10001) goto LAB_00106bc8;
  }
  *puVar8 = 0x10000;
LAB_00106bc8:
  for (; pEVar6 < pEVar3 + sVar7; pEVar6 = pEVar6 + 1) {
    pEVar6->outgoingReliableSequenceNumber = 0;
    pEVar6->outgoingUnreliableSequenceNumber = 0;
    pEVar6->incomingUnreliableSequenceNumber = 0;
    (pEVar6->incomingReliableCommands).sentinel.next = &(pEVar6->incomingReliableCommands).sentinel;
    (pEVar6->incomingReliableCommands).sentinel.previous =
         &(pEVar6->incomingReliableCommands).sentinel;
    (pEVar6->incomingUnreliableCommands).sentinel.next =
         &(pEVar6->incomingUnreliableCommands).sentinel;
    (pEVar6->incomingUnreliableCommands).sentinel.previous =
         &(pEVar6->incomingUnreliableCommands).sentinel;
    *(undefined4 *)(pEVar6->reliableWindows + 0xf) = 0;
    pEVar6->usedReliableWindows = 0;
    pEVar6->reliableWindows[0] = 0;
    pEVar6->reliableWindows[1] = 0;
    pEVar6->reliableWindows[2] = 0;
    pEVar6->reliableWindows[3] = 0;
    pEVar6->reliableWindows[4] = 0;
    pEVar6->reliableWindows[5] = 0;
    pEVar6->reliableWindows[6] = 0;
    pEVar6->reliableWindows[7] = 0;
    pEVar6->reliableWindows[8] = 0;
    pEVar6->reliableWindows[9] = 0;
    pEVar6->reliableWindows[10] = 0;
    pEVar6->reliableWindows[0xb] = 0;
    pEVar6->reliableWindows[0xc] = 0;
    pEVar6->reliableWindows[0xd] = 0;
    pEVar6->reliableWindows[0xe] = 0;
    pEVar3 = *(ENetChannel **)(puVar8 + -0x2b);
  }
  command._0_2_ = 0xff82;
  command.acknowledge.receivedReliableSequenceNumber =
       *(uint16_t *)((long)puVar8 + -0xda) << 8 | *(uint16_t *)((long)puVar8 + -0xda) >> 8;
  command.connect.incomingSessionID = *(uint8_t *)((long)puVar8 + -0xd3);
  command.connect.outgoingSessionID = *(undefined1 *)(puVar8 + -0x35);
  uVar5 = puVar8[-1];
  command.connect.mtu =
       uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 << 0x18;
  uVar5 = *puVar8;
  command.connect.windowSize =
       uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 << 0x18;
  command.connect.channelCount = (int)sVar7 << 0x18;
  uVar5 = host->incomingBandwidth;
  command.connect.incomingBandwidth =
       uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 << 0x18;
  uVar5 = host->outgoingBandwidth;
  command.connect.outgoingBandwidth =
       uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 << 0x18;
  uVar5 = puVar8[-0xc];
  command.connect.packetThrottleInterval =
       uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 << 0x18;
  uVar5 = puVar8[-0xe];
  command.connect.packetThrottleAcceleration =
       uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 << 0x18;
  uVar5 = puVar8[-0xd];
  command.connect.packetThrottleDeceleration =
       uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 << 0x18;
  command.connect.connectID = puVar8[-0x36];
  command.connect.data = data >> 0x18 | (data & 0xff0000) >> 8 | (data & 0xff00) << 8 | data << 0x18
  ;
  enet_peer_queue_outgoing_command(pEVar4,&command,(ENetPacket *)0x0,0,0);
  return pEVar4;
}

Assistant:

ENetPeer* enet_host_connect(ENetHost* host, const ENetAddress* address, size_t channelCount, uint32_t data) {
	ENET_LOG_TRACE("A ENet Host is trying to establish a connection.");

	ENetPeer* currentPeer;
	ENetChannel* channel;
	ENetProtocol command;

	if (channelCount < ENET_PROTOCOL_MINIMUM_CHANNEL_COUNT)
		channelCount = ENET_PROTOCOL_MINIMUM_CHANNEL_COUNT;
	else if (channelCount > ENET_PROTOCOL_MAXIMUM_CHANNEL_COUNT)
		channelCount = ENET_PROTOCOL_MAXIMUM_CHANNEL_COUNT;

	for (currentPeer = host->peers; currentPeer < &host->peers[host->peerCount]; ++currentPeer) {
		if (currentPeer->state == ENET_PEER_STATE_DISCONNECTED)
			break;
	}

	if (currentPeer >= &host->peers[host->peerCount])
		return NULL;

	currentPeer->channels = (ENetChannel*)enet_malloc(channelCount * sizeof(ENetChannel));

	if (currentPeer->channels == NULL)
		return NULL;

	currentPeer->channelCount = channelCount;
	currentPeer->state = ENET_PEER_STATE_CONNECTING;
	currentPeer->address = *address;
	currentPeer->connectID = ++host->randomSeed;

	if (host->outgoingBandwidth == 0)
		currentPeer->windowSize = ENET_PROTOCOL_MAXIMUM_WINDOW_SIZE;
	else
		currentPeer->windowSize = (host->outgoingBandwidth / ENET_PEER_WINDOW_SIZE_SCALE) * ENET_PROTOCOL_MINIMUM_WINDOW_SIZE;

	if (currentPeer->windowSize < ENET_PROTOCOL_MINIMUM_WINDOW_SIZE)
		currentPeer->windowSize = ENET_PROTOCOL_MINIMUM_WINDOW_SIZE;
	else if (currentPeer->windowSize > ENET_PROTOCOL_MAXIMUM_WINDOW_SIZE)
		currentPeer->windowSize = ENET_PROTOCOL_MAXIMUM_WINDOW_SIZE;

	for (channel = currentPeer->channels; channel < &currentPeer->channels[channelCount]; ++channel) {
		channel->outgoingReliableSequenceNumber = 0;
		channel->outgoingUnreliableSequenceNumber = 0;
		channel->incomingReliableSequenceNumber = 0;
		channel->incomingUnreliableSequenceNumber = 0;

		enet_list_clear(&channel->incomingReliableCommands);
		enet_list_clear(&channel->incomingUnreliableCommands);

		channel->usedReliableWindows = 0;

		memset(channel->reliableWindows, 0, sizeof(channel->reliableWindows));
	}

	command.header.command = ENET_PROTOCOL_COMMAND_CONNECT | ENET_PROTOCOL_COMMAND_FLAG_ACKNOWLEDGE;
	command.header.channelID = 0xFF;
	command.connect.outgoingPeerID = ENET_HOST_TO_NET_16(currentPeer->incomingPeerID);
	command.connect.incomingSessionID = currentPeer->incomingSessionID;
	command.connect.outgoingSessionID = currentPeer->outgoingSessionID;
	command.connect.mtu = ENET_HOST_TO_NET_32(currentPeer->mtu);
	command.connect.windowSize = ENET_HOST_TO_NET_32(currentPeer->windowSize);
	command.connect.channelCount = ENET_HOST_TO_NET_32(channelCount);
	command.connect.incomingBandwidth = ENET_HOST_TO_NET_32(host->incomingBandwidth);
	command.connect.outgoingBandwidth = ENET_HOST_TO_NET_32(host->outgoingBandwidth);
	command.connect.packetThrottleInterval = ENET_HOST_TO_NET_32(currentPeer->packetThrottleInterval);
	command.connect.packetThrottleAcceleration = ENET_HOST_TO_NET_32(currentPeer->packetThrottleAcceleration);
	command.connect.packetThrottleDeceleration = ENET_HOST_TO_NET_32(currentPeer->packetThrottleDeceleration);
	command.connect.connectID = currentPeer->connectID;
	command.connect.data = ENET_HOST_TO_NET_32(data);

	enet_peer_queue_outgoing_command(currentPeer, &command, NULL, 0, 0);

	return currentPeer;
}